

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetTargetVersion
          (cmGeneratorTarget *this,bool soversion,int *major,int *minor,int *patch)

{
  TargetType TVar1;
  int iVar2;
  char *pcVar3;
  int parsed_minor;
  int parsed_patch;
  int parsed_major;
  int local_58;
  int local_54;
  string local_50;
  
  *major = 0;
  *minor = 0;
  *patch = 0;
  TVar1 = GetType(this);
  if (TVar1 == INTERFACE_LIBRARY) {
    __assert_fail("this->GetType() != cmStateEnums::INTERFACE_LIBRARY",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorTarget.cxx"
                  ,0x1344,
                  "void cmGeneratorTarget::GetTargetVersion(bool, int &, int &, int &) const");
  }
  pcVar3 = "VERSION";
  if (soversion) {
    pcVar3 = "SOVERSION";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,pcVar3,(allocator<char> *)&local_58);
  pcVar3 = GetProperty(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (pcVar3 != (char *)0x0) {
    iVar2 = __isoc99_sscanf(pcVar3,"%d.%d.%d",&local_50,&local_58,&local_54);
    if (iVar2 != 1) {
      if (iVar2 != 2) {
        if (iVar2 != 3) {
          return;
        }
        *patch = local_54;
      }
      *minor = local_58;
    }
    *major = (int)local_50._M_dataplus._M_p;
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetTargetVersion(bool soversion, int& major,
                                         int& minor, int& patch) const
{
  // Set the default values.
  major = 0;
  minor = 0;
  patch = 0;

  assert(this->GetType() != cmStateEnums::INTERFACE_LIBRARY);

  // Look for a VERSION or SOVERSION property.
  const char* prop = soversion ? "SOVERSION" : "VERSION";
  if (const char* version = this->GetProperty(prop)) {
    // Try to parse the version number and store the results that were
    // successfully parsed.
    int parsed_major;
    int parsed_minor;
    int parsed_patch;
    switch (sscanf(version, "%d.%d.%d", &parsed_major, &parsed_minor,
                   &parsed_patch)) {
      case 3:
        patch = parsed_patch;
        CM_FALLTHROUGH;
      case 2:
        minor = parsed_minor;
        CM_FALLTHROUGH;
      case 1:
        major = parsed_major;
        CM_FALLTHROUGH;
      default:
        break;
    }
  }
}